

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

ByteData *
cfd::core::GetPsbtGlobal
          (ByteData *__return_storage_ptr__,ByteData *key_data,wally_psbt *psbt,bool *is_find)

{
  wally_map_item *pwVar1;
  CfdException *pCVar2;
  Transaction tx;
  size_t index;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  Transaction local_a0;
  ByteData local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (psbt == (wally_psbt *)0x0) {
    local_a0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5e9c8e;
    local_a0.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x3a5;
    local_a0.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x5d7a7d;
    logger::log<>((CfdSourceLocation *)&local_a0,kCfdLogLevelWarning,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_a0.vin_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"psbt pointer is null.","");
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&local_a0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (is_find != (bool *)0x0) {
    *is_find = false;
  }
  ByteData::GetBytes(&local_48,key_data);
  if (*local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start == 0xfb) {
    if ((long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != 1) {
      local_a0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5e9c8e;
      local_a0.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x3b6;
      local_a0.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x5d7a7d;
      logger::log<>((CfdSourceLocation *)&local_a0,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      local_a0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_a0.vin_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_a0);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    Serializer::Serializer((Serializer *)&local_a0);
    Serializer::AddDirectNumber((Serializer *)&local_a0,psbt->version);
    Serializer::Output(__return_storage_ptr__,(Serializer *)&local_a0);
    local_a0.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&PTR__Serializer_007405b8;
    if ((void *)CONCAT44(local_a0.super_AbstractTransaction.wally_tx_pointer_._4_4_,
                         local_a0.super_AbstractTransaction.wally_tx_pointer_._0_4_) != (void *)0x0)
    {
      operator_delete((void *)CONCAT44(local_a0.super_AbstractTransaction.wally_tx_pointer_._4_4_,
                                       local_a0.super_AbstractTransaction.wally_tx_pointer_._0_4_));
    }
  }
  else if (*local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    if ((long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != 1) {
      local_a0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5e9c8e;
      local_a0.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x3ad;
      local_a0.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x5d7a7d;
      logger::log<>((CfdSourceLocation *)&local_a0,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      local_a0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_a0.vin_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_a0);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    ConvertBitcoinTxFromWally(&local_60,psbt->tx,false);
    Transaction::Transaction(&local_a0,&local_60);
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    AbstractTransaction::GetData(__return_storage_ptr__,&local_a0.super_AbstractTransaction);
    Transaction::~Transaction(&local_a0);
  }
  else {
    local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_a0.vin_;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"global unknowns","");
    FindPsbtMap(&psbt->unknowns,&local_48,(string *)&local_a0,(size_t *)&local_60);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_a0.super_AbstractTransaction._vptr_AbstractTransaction != &local_a0.vin_) {
      operator_delete(local_a0.super_AbstractTransaction._vptr_AbstractTransaction);
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar1 = (psbt->unknowns).items;
    ByteData::ByteData(__return_storage_ptr__,
                       pwVar1[(long)local_60.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start].value,
                       (uint32_t)
                       pwVar1[(long)local_60.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start].value_len);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static ByteData GetPsbtGlobal(
    const ByteData &key_data, struct wally_psbt *psbt, bool *is_find) {
  if (psbt == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }
  if (is_find != nullptr) *is_find = false;
  const auto key = key_data.GetBytes();
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtGlobalUnsignedTx) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (is_find != nullptr) *is_find = true;
    Transaction tx(ConvertBitcoinTxFromWally(psbt->tx, false));
    return tx.GetData();
  } else if (key[0] == Psbt::kPsbtGlobalVersion) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (is_find != nullptr) *is_find = true;
    // TODO(k-matsuzawa) need endian support.
    Serializer builder;
    builder.AddDirectNumber(psbt->version);
    return builder.Output();
  } else {
    size_t index = 0;
    try {
      FindPsbtMap(&psbt->unknowns, key, "global unknowns", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          psbt->unknowns.items[index].value,
          static_cast<uint32_t>(psbt->unknowns.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  }
  return ByteData();
}